

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

gboolean timerSourceCheck(GSource *source)

{
  GTimerSource *in_RDI;
  GTimerSource *src;
  gboolean local_4;
  
  if ((in_RDI->runWithIdlePriority & 1U) == 0) {
    local_4 = timerSourceCheckHelper(in_RDI);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static gboolean timerSourceCheck(GSource *source)
{
    GTimerSource *src = reinterpret_cast<GTimerSource *>(source);
    if (src->runWithIdlePriority)
        return false;
    return timerSourceCheckHelper(src);
}